

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall SM_Manager::SetUpRelCatAttributes(SM_Manager *this,DataAttrInfo *attributes)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0x40;
  do {
    builtin_strncpy(attributes->relName + lVar2 + -0x40,"relcat",7);
    pcVar1 = attributes->relName + lVar2;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    lVar2 = lVar2 + 0x44;
  } while (lVar2 != 0x150);
  builtin_strncpy(attributes->attrName + 8,"tupleLength",0xc);
  builtin_strncpy(attributes->attrName + 0x14,"attrC",5);
  builtin_strncpy(attributes->attrName,"relName",8);
  attributes[1].attrName[0] = 't';
  attributes[1].attrName[1] = 'u';
  attributes[1].attrName[2] = 'p';
  attributes[1].attrName[3] = 'l';
  attributes[1].attrName[4] = 'e';
  attributes[1].attrName[5] = 'L';
  attributes[1].attrName[6] = 'e';
  attributes[1].attrName[7] = 'n';
  attributes[1].attrName[8] = 'g';
  attributes[1].attrName[9] = 't';
  attributes[1].attrName[10] = 'h';
  attributes[1].attrName[0xb] = '\0';
  attributes[1].attrName[0xc] = 'a';
  attributes[1].attrName[0xd] = 't';
  attributes[1].attrName[0xe] = 't';
  attributes[1].attrName[0xf] = 'r';
  attributes[1].attrName[9] = 't';
  attributes[1].attrName[10] = 'h';
  attributes[1].attrName[0xb] = '\0';
  attributes[1].attrName[0xc] = 'a';
  attributes[1].attrName[0xd] = 't';
  attributes[1].attrName[0xe] = 't';
  attributes[1].attrName[0xf] = 'r';
  attributes[1].attrName[0x10] = 'C';
  attributes[1].attrName[0x11] = 'o';
  attributes[1].attrName[0x12] = 'u';
  attributes[1].attrName[0x13] = 'n';
  attributes[1].attrName[0x14] = 't';
  attributes[1].attrName[0x15] = '\0';
  attributes[1].attrName[0x16] = 'i';
  attributes[1].attrName[0x17] = 'n';
  attributes[1].attrName[0x18] = 'd';
  attributes[2].attrName[0] = 'a';
  attributes[2].attrName[1] = 't';
  attributes[2].attrName[2] = 't';
  attributes[2].attrName[3] = 'r';
  attributes[2].attrName[4] = 'C';
  attributes[2].attrName[5] = 'o';
  attributes[2].attrName[6] = 'u';
  attributes[2].attrName[7] = 'n';
  attributes[2].attrName[8] = 't';
  attributes[2].attrName[9] = '\0';
  attributes[2].attrName[10] = 'i';
  attributes[2].attrName[0xb] = 'n';
  attributes[2].attrName[0xc] = 'd';
  attributes[2].attrName[0xd] = 'e';
  attributes[2].attrName[0xe] = 'x';
  attributes[2].attrName[0xf] = 'C';
  attributes[2].attrName[9] = '\0';
  attributes[2].attrName[10] = 'i';
  attributes[2].attrName[0xb] = 'n';
  attributes[2].attrName[0xc] = 'd';
  attributes[2].attrName[0xd] = 'e';
  attributes[2].attrName[0xe] = 'x';
  attributes[2].attrName[0xf] = 'C';
  attributes[2].attrName[0x10] = 'o';
  attributes[2].attrName[0x11] = 'u';
  attributes[2].attrName[0x12] = 'n';
  attributes[2].attrName[0x13] = 't';
  attributes[2].attrName[0x14] = '\0';
  attributes[2].attrName[0x15] = 'a';
  attributes[2].attrName[0x16] = 't';
  attributes[2].attrName[0x17] = 't';
  attributes[2].attrName[0x18] = 'r';
  attributes[3].attrName[0] = 'i';
  attributes[3].attrName[1] = 'n';
  attributes[3].attrName[2] = 'd';
  attributes[3].attrName[3] = 'e';
  attributes[3].attrName[4] = 'x';
  attributes[3].attrName[5] = 'C';
  attributes[3].attrName[6] = 'o';
  attributes[3].attrName[7] = 'u';
  attributes[3].attrName[8] = 'n';
  attributes[3].attrName[9] = 't';
  attributes[3].attrName[10] = '\0';
  attributes[3].attrName[0xb] = 'a';
  attributes[3].attrName[0xc] = 't';
  attributes[3].attrName[0xd] = 't';
  attributes[3].attrName[0xe] = 'r';
  attributes[3].attrName[0xf] = 'N';
  attributes[3].attrName[9] = 't';
  attributes[3].attrName[10] = '\0';
  attributes[3].attrName[0xb] = 'a';
  attributes[3].attrName[0xc] = 't';
  attributes[3].attrName[0xd] = 't';
  attributes[3].attrName[0xe] = 'r';
  attributes[3].attrName[0xf] = 'N';
  attributes[3].attrName[0x10] = 'a';
  attributes[3].attrName[0x11] = 'm';
  attributes[3].attrName[0x12] = 'e';
  attributes[3].attrName[0x13] = '\0';
  attributes[3].attrName[0x14] = 'o';
  attributes[3].attrName[0x15] = 'f';
  attributes[3].attrName[0x16] = 'f';
  attributes[3].attrName[0x17] = 's';
  attributes[3].attrName[0x18] = 'e';
  attributes->offset = 0;
  attributes[1].offset = 0x1c;
  attributes[2].offset = 0x20;
  attributes[3].offset = 0x24;
  attributes->attrType = STRING;
  attributes->attrLength = 0x19;
  attributes[1].attrType = INT;
  attributes[1].attrLength = 4;
  attributes[2].attrType = INT;
  attributes[2].attrLength = 4;
  attributes[3].attrType = INT;
  attributes[3].attrLength = 4;
  return 0;
}

Assistant:

RC SM_Manager::SetUpRelCatAttributes(DataAttrInfo *attributes){
  int numAttr = 4;
  for(int i= 0; i < numAttr; i++){
    memcpy(attributes[i].relName, "relcat", strlen("relcat") + 1);
    attributes[i].indexNo = 0;
  }
  
  memcpy(attributes[0].attrName, "relName", MAXNAME + 1);
  memcpy(attributes[1].attrName, "tupleLength", MAXNAME + 1);
  memcpy(attributes[2].attrName, "attrCount", MAXNAME + 1);
  memcpy(attributes[3].attrName, "indexCount", MAXNAME + 1);

  attributes[0].offset = (int) offsetof(RelCatEntry,relName);
  attributes[1].offset = (int) offsetof(RelCatEntry,tupleLength);
  attributes[2].offset = (int) offsetof(RelCatEntry,attrCount);
  attributes[3].offset = (int) offsetof(RelCatEntry,indexCount);

  attributes[0].attrType = STRING;
  attributes[1].attrType = INT;
  attributes[2].attrType = INT;
  attributes[3].attrType = INT;

  attributes[0].attrLength = MAXNAME + 1;
  attributes[1].attrLength = 4;
  attributes[2].attrLength = 4;
  attributes[3].attrLength = 4;

  return (0);
}